

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseSignal(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_SignalType_t SigType)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  int nLsb;
  int nMsb;
  char Buffer [1000];
  char *local_448;
  uint local_440;
  uint local_43c;
  Abc_Ntk_t *local_438;
  Ver_SignalType_t local_430;
  Ver_SignalType_t local_42c;
  Ver_Man_t *local_428;
  Ver_Stream_t *local_420;
  char local_418 [1000];
  
  local_420 = pMan->pReader;
  local_440 = 0xffffffff;
  local_43c = 0xffffffff;
  local_438 = pNtk;
  pcVar5 = Ver_ParseGetName(pMan);
  if (pcVar5 != (char *)0x0) {
    local_430 = SigType & ~VER_SIG_OUTPUT;
    local_42c = SigType & ~VER_SIG_INPUT;
    local_428 = pMan;
    do {
      local_448 = pcVar5;
      iVar4 = strcmp(pcVar5,"wire");
      if (iVar4 != 0) {
        if ((*pcVar5 == '[') && (pMan->fNameLast == 0)) {
          if ((local_43c != 0xffffffff) || (local_440 != 0xffffffff)) {
            __assert_fail("nMsb == -1 && nLsb == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                          ,0x338,"int Ver_ParseSignal(Ver_Man_t *, Abc_Ntk_t *, Ver_SignalType_t)");
          }
          Ver_ParseSignalPrefix(pMan,&local_448,(int *)&local_43c,(int *)&local_440);
          if ((*local_448 == '\0') && (local_448 = Ver_ParseGetName(pMan), local_448 == (char *)0x0)
             ) {
            return 0;
          }
        }
        uVar2 = local_43c;
        uVar1 = local_440;
        pcVar5 = local_448;
        if ((local_43c & local_440) == 0xffffffff) {
          if (local_430 == VER_SIG_INPUT) {
            Ver_ParseCreatePi(local_438,local_448);
          }
          if (local_42c == VER_SIG_REG) {
            Abc_NtkFindOrCreateNet(local_438,local_448);
          }
          else if (local_42c == VER_SIG_OUTPUT) {
            Ver_ParseCreatePo(local_438,local_448);
          }
        }
        else {
          if (((int)local_43c < 0) || ((int)local_440 < 0)) {
            __assert_fail("nMsb >= 0 && nLsb >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                          ,0x350,"int Ver_ParseSignal(Ver_Man_t *, Abc_Ntk_t *, Ver_SignalType_t)");
          }
          Ver_ParseInsertsSuffix(pMan,local_448,local_43c,local_440);
          iVar6 = uVar2 - uVar1;
          iVar4 = -iVar6;
          if (iVar6 != iVar4 && SBORROW4(iVar6,iVar4) == iVar6 * 2 < 0) {
            iVar4 = iVar6;
          }
          iVar4 = iVar4 + 1;
          uVar7 = uVar1;
          do {
            if (uVar2 == uVar1) {
              strcpy(local_418,pcVar5);
            }
            else {
              sprintf(local_418,"%s[%d]",pcVar5,(ulong)uVar7);
            }
            if (local_430 == VER_SIG_INPUT) {
              Ver_ParseCreatePi(local_438,local_418);
            }
            if (local_42c == VER_SIG_REG) {
              Abc_NtkFindOrCreateNet(local_438,local_418);
            }
            else if (local_42c == VER_SIG_OUTPUT) {
              Ver_ParseCreatePo(local_438,local_418);
            }
            uVar7 = uVar7 + (uint)(iVar6 != 0 && (int)uVar1 <= (int)uVar2) * 2 + -1;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        cVar3 = Ver_StreamPopChar(local_420);
        pMan = local_428;
        if (cVar3 != ',') {
          if (cVar3 != ';') {
            builtin_strncpy(local_428->sError + 0x1c,"pected ,",8);
            builtin_strncpy(local_428->sError + 0x24," or ;).",8);
            builtin_strncpy(local_428->sError + 0x10,"nal line",8);
            builtin_strncpy(local_428->sError + 0x18," (expect",8);
            builtin_strncpy(local_428->sError,"Cannot p",8);
            builtin_strncpy(local_428->sError + 8,"arse sig",8);
            Ver_ParsePrintErrorMessage(local_428);
            return 0;
          }
          return 1;
        }
      }
      pcVar5 = Ver_ParseGetName(pMan);
    } while (pcVar5 != (char *)0x0);
  }
  return 0;
}

Assistant:

int Ver_ParseSignal( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_SignalType_t SigType )
{
    Ver_Stream_t * p = pMan->pReader;
    char Buffer[1000], Symbol, * pWord;
    int nMsb, nLsb, Bit, Limit, i;
    nMsb = nLsb = -1;
    while ( 1 )
    {
        // get the next word
        pWord = Ver_ParseGetName( pMan );
        if ( pWord == NULL )
            return 0;

        if ( !strcmp(pWord, "wire") )
            continue;

        // check if the range is specified
        if ( pWord[0] == '[' && !pMan->fNameLast )
        {
            assert( nMsb == -1 && nLsb == -1 );
            Ver_ParseSignalPrefix( pMan, &pWord, &nMsb, &nLsb );
            // check the case when there is space between bracket and the next word
            if ( *pWord == 0 )
            {
                // get the signal name
                pWord = Ver_ParseGetName( pMan );
                if ( pWord == NULL )
                    return 0;
            }
        }

        // create signals
        if ( nMsb == -1 && nLsb == -1 )
        {
            if ( SigType == VER_SIG_INPUT || SigType == VER_SIG_INOUT )
                Ver_ParseCreatePi( pNtk, pWord );
            if ( SigType == VER_SIG_OUTPUT || SigType == VER_SIG_INOUT )
                Ver_ParseCreatePo( pNtk, pWord );
            if ( SigType == VER_SIG_WIRE || SigType == VER_SIG_REG )
                Abc_NtkFindOrCreateNet( pNtk, pWord );
        }
        else
        {
            assert( nMsb >= 0 && nLsb >= 0 );
            // add to the hash table
            Ver_ParseInsertsSuffix( pMan, pWord, nMsb, nLsb );
            // add signals from Lsb to Msb
            Limit = nMsb > nLsb? nMsb - nLsb + 1: nLsb - nMsb + 1;
            for ( i = 0, Bit = nLsb; i < Limit; i++, Bit = nMsb > nLsb ? Bit + 1: Bit - 1  )
            {
//                sprintf( Buffer, "%s[%d]", pWord, Bit );
                if ( Limit > 1 )
                    sprintf( Buffer, "%s[%d]", pWord, Bit );
                else
                    sprintf( Buffer, "%s", pWord );
                if ( SigType == VER_SIG_INPUT || SigType == VER_SIG_INOUT )
                    Ver_ParseCreatePi( pNtk, Buffer );
                if ( SigType == VER_SIG_OUTPUT || SigType == VER_SIG_INOUT )
                    Ver_ParseCreatePo( pNtk, Buffer );
                if ( SigType == VER_SIG_WIRE || SigType == VER_SIG_REG )
                    Abc_NtkFindOrCreateNet( pNtk, Buffer );
            }
        }

        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ',' )
            continue;
        if ( Symbol == ';' )
            return 1;
        break;
    }
    sprintf( pMan->sError, "Cannot parse signal line (expected , or ;)." );
    Ver_ParsePrintErrorMessage( pMan );
    return 0;
}